

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::FiberPool::runSynchronously(FiberPool *this,FunctionParam<void_()> func)

{
  Own<kj::_::FiberStack,_std::nullptr_t> stack;
  SynchronousFunc syncFunc;
  undefined1 local_1d0 [24];
  undefined1 local_1b8 [16];
  NullableValue<kj::Exception> local_1a8;
  
  local_1b8._0_8_ = func.space._8_8_;
  local_1d0._16_8_ = func.space._0_8_;
  local_1b8._8_8_ = local_1d0 + 0x10;
  local_1a8.isSet = false;
  Impl::takeStack((Impl *)local_1d0);
  kj::_::FiberStack::initialize((FiberStack *)local_1d0._8_8_,(SynchronousFunc *)(local_1b8 + 8));
  kj::_::FiberStack::switchToFiber((FiberStack *)local_1d0._8_8_);
  kj::_::FiberStack::reset((FiberStack *)local_1d0._8_8_);
  if ((FiberStack *)local_1d0._8_8_ != (FiberStack *)0x0) {
    local_1d0._8_8_ = (FiberStack *)0x0;
    (**(code **)*(_func_int **)local_1d0._0_8_)();
  }
  if (local_1a8.isSet == true) {
    throwRecoverableException(&local_1a8.field_1.value,0);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_1a8);
  return;
}

Assistant:

void FiberPool::runSynchronously(kj::FunctionParam<void()> func) const {
  ensureThreadCanRunFibers();

  _::FiberStack::SynchronousFunc syncFunc { func, kj::none };

  {
    auto stack = impl->takeStack();
    stack->initialize(syncFunc);
    stack->switchToFiber();
    stack->reset();  // safe to reuse
  }

  KJ_IF_SOME(e, syncFunc.exception) {
    kj::throwRecoverableException(kj::mv(e));
  }
}